

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O0

ssize_t __thiscall
gpu::shared_device_buffer::read(shared_device_buffer *this,int __fd,void *__buf,size_t __nbytes)

{
  Type TVar1;
  gpu_exception *this_00;
  element_type *this_01;
  shared_device_buffer *extraout_RAX;
  undefined4 in_register_00000034;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  undefined1 local_108 [24];
  Context context;
  string local_d8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t offset_local;
  size_t size_local;
  void *data_local;
  shared_device_buffer *this_local;
  
  size_local = CONCAT44(in_register_00000034,__fd);
  if (__buf != (void *)0x0) {
    local_28 = __nbytes;
    offset_local = (size_t)__buf;
    data_local = this;
    if ((void *)this->size_ < __buf) {
      context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 1;
      this_00 = (gpu_exception *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>(&local_a8,offset_local);
      std::operator+(&local_88,"Not enough data in this device buffer: ",&local_a8);
      std::operator+(&local_68,&local_88," > ");
      to_string<unsigned_long>(&local_d8,this->size_);
      std::operator+(&local_48,&local_68,&local_d8);
      gpu_exception::gpu_exception(this_00,&local_48);
      context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._7_1_ = 0;
      __cxa_throw(this_00,&gpu_exception::typeinfo,gpu_exception::~gpu_exception);
    }
    Context::Context((Context *)(local_108 + 0x10));
    TVar1 = Context::type((Context *)(local_108 + 0x10));
    if (TVar1 == TypeOpenCL) {
      Context::cl((Context *)local_108);
      this_01 = std::
                __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_108);
      ocl::OpenCLEngine::readBuffer
                (this_01,(cl_mem)this->data_,1,this->offset_ + local_28,offset_local,
                 (void *)size_local);
      std::shared_ptr<ocl::OpenCLEngine>::~shared_ptr((shared_ptr<ocl::OpenCLEngine> *)local_108);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_128,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/shared_device_buffer.cpp"
                 ,&local_129);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_150,"No GPU context!",&local_151);
      raiseException(&local_128,0x13d,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
    }
    Context::~Context((Context *)(local_108 + 0x10));
    this = extraout_RAX;
  }
  return (ssize_t)this;
}

Assistant:

void shared_device_buffer::read(void *data, size_t size, size_t offset) const
{
	if (size == 0)
		return;
	if (size > size_)
		throw gpu_exception("Not enough data in this device buffer: " + to_string(size) + " > " + to_string(size_));

	Context context;
	switch (context.type()) {
#ifdef CUDA_SUPPORT
	case Context::TypeCUDA:
		CUDA_SAFE_CALL(cudaMemcpy(data, (char *) cuptr() + offset, size, cudaMemcpyDeviceToHost));
		break;
#endif
	case Context::TypeOpenCL:
		context.cl()->readBuffer((cl_mem) data_, CL_TRUE, offset_ + offset, size, data);
		break;
	default:
		gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}
}